

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O3

void init_fdtd_2D_medium(fdtd2D *fdtd,init_medium_fun_2D permeability_invR,
                        init_medium_fun_2D permittivity_invR,void *user)

{
  long lVar1;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  float_type fVar8;
  double dVar9;
  
  uVar6 = fdtd->sizeX;
  if (uVar6 != 0) {
    uVar5 = fdtd->sizeY;
    pvVar3 = fdtd->permittivity_inv;
    pvVar4 = fdtd->permeability_inv;
    dVar7 = 0.0;
    uVar2 = 0;
    lVar1 = uVar5 * 8;
    do {
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        dVar9 = 0.0;
        uVar6 = 0;
        do {
          fVar8 = (*permeability_invR)(dVar7,dVar9,user);
          *(double *)((long)pvVar4 + uVar6 * 8) = 1.0 / (fVar8 * 1.2566370614359173e-06);
          fVar8 = (*permittivity_invR)(dVar7,dVar9,user);
          *(double *)((long)pvVar3 + uVar6 * 8) = 1.0 / (fVar8 * 8.85418781762039e-12);
          uVar6 = uVar6 + 1;
          dVar9 = dVar9 + fdtd->dy;
          uVar5 = fdtd->sizeY;
        } while (uVar6 < uVar5);
        uVar6 = fdtd->sizeX;
      }
      dVar7 = dVar7 + fdtd->dx;
      uVar2 = uVar2 + 1;
      pvVar3 = (void *)((long)pvVar3 + lVar1);
      pvVar4 = (void *)((long)pvVar4 + lVar1);
    } while (uVar2 < uVar6);
  }
  return;
}

Assistant:

void init_fdtd_2D_medium(struct fdtd2D *fdtd,
                         init_medium_fun_2D permeability_invR,
                         init_medium_fun_2D permittivity_invR, void *user) {
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, permittivity_inv,
                    fdtd->permittivity_inv);
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, permeability_inv,
                    fdtd->permeability_inv);
  float_type posX = float_cst(0.);
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i, posX += fdtd->dx) {
    float_type posY = float_cst(0.);
    for (uintmax_t j = 0; j < fdtd->sizeY; ++j, posY += fdtd->dy) {
      permeability_inv[i][j] =
          float_cst(1.) / (permeability_invR(posX, posY, user) * mu0);
      permittivity_inv[i][j] =
          float_cst(1.) / (permittivity_invR(posX, posY, user) * eps0);
    }
  }
}